

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_gfx.h
# Opt level: O1

void sg_begin_default_pass(sg_pass_action *pass_action,wchar_t width,wchar_t height)

{
  sg_pass_action pa;
  sg_pass_action local_80;
  
  if (!_sg.valid) {
    __assert_fail("_sg.valid",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/sokol-src/sokol_gfx.h"
                  ,0x3fb2,"void sg_begin_default_pass(const sg_pass_action *, int, int)");
  }
  if (pass_action != (sg_pass_action *)0x0) {
    if ((pass_action->_start_canary == 0) && (pass_action->_end_canary == 0)) {
      _sg_resolve_default_pass_action(pass_action,&local_80);
      _sg.cur_pass.id = 0;
      _sg.pass_valid = true;
      _sg_begin_pass((_sg_pass_t *)0x0,&local_80,width,height);
      return;
    }
    __assert_fail("(pass_action->_start_canary == 0) && (pass_action->_end_canary == 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/sokol-src/sokol_gfx.h"
                  ,0x3fb4,"void sg_begin_default_pass(const sg_pass_action *, int, int)");
  }
  __assert_fail("pass_action",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/sokol-src/sokol_gfx.h"
                ,0x3fb3,"void sg_begin_default_pass(const sg_pass_action *, int, int)");
}

Assistant:

inline void sg_begin_default_pass(const sg_pass_action& pass_action, int width, int height) { return sg_begin_default_pass(&pass_action, width, height); }